

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks_tests.c
# Opt level: O2

S func(void)

{
  undefined8 uVar1;
  int *piVar2;
  
  uVar1 = get_test_reporter();
  piVar2 = (int *)mock_(uVar1,"func",
                        "/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/mocks_tests.c"
                        ,0xe8,"",0);
  return (S)*piVar2;
}

Assistant:

S func(void) {
    S s;
    S *sp;

    sp = (S *)mock();

    /* Copy content of struct pointed to by returned value */
    memcpy(&s, sp, sizeof(S));

    /* Return it */
    return s;
}